

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_linearization.cc
# Opt level: O2

QPDFObjectHandle __thiscall
QPDF::readHintStream(QPDF *this,Pipeline *pl,qpdf_offset_t offset,size_t length)

{
  _func_int **pp_Var1;
  bool bVar2;
  mapped_type *pmVar3;
  longlong lVar4;
  long __val;
  QPDFExc *pQVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  qpdf_offset_t __val_00;
  qpdf_offset_t __val_01;
  QPDFObjectHandle QVar6;
  string_view msg;
  string local_160;
  QPDFObjectHandle length_obj;
  string local_130;
  QPDFObjectHandle H;
  QPDFObjGen og;
  size_t length_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  og.obj = 0;
  og.gen = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_160,"linearization hint stream",(allocator<char> *)&local_130);
  readObjectAtOffset((QPDF *)&H,SUB81(pl,0),0,(string *)length,(QPDFObjGen)&local_160,
                     (QPDFObjGen *)0x0,false);
  std::__cxx11::string::~string((string *)&local_160);
  pmVar3 = std::
           map<QPDFObjGen,_QPDF::ObjCache,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_>_>
           ::operator[]((map<QPDFObjGen,_QPDF::ObjCache,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_>_>
                         *)(pl->_vptr_Pipeline + 0x35),&og);
  __val_00 = pmVar3->end_before_space;
  __val_01 = pmVar3->end_after_space;
  bVar2 = QPDFObjectHandle::isStream(&H);
  if (!bVar2) {
    pQVar5 = (QPDFExc *)__cxa_allocate_exception(0x80);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_160,"linearization dictionary",(allocator<char> *)&local_d0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_130,"hint table is not a stream",(allocator<char> *)&local_f0);
    damagedPDF(pQVar5,(QPDF *)pl,&local_160,&local_130);
    __cxa_throw(pQVar5,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
  }
  QPDFObjectHandle::getDict((QPDFObjectHandle *)this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_160,"/Length",(allocator<char> *)&local_130);
  QPDFObjectHandle::getKey(&length_obj,(string *)this);
  std::__cxx11::string::~string((string *)&local_160);
  bVar2 = QPDFObjectHandle::isIndirect(&length_obj);
  if (bVar2) {
    QPDFObjectHandle::getIntValue(&length_obj);
    pp_Var1 = pl->_vptr_Pipeline;
    local_160._M_dataplus._M_p = (pointer)QPDFObjectHandle::getObjGen(&length_obj);
    pmVar3 = std::
             map<QPDFObjGen,_QPDF::ObjCache,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_>_>
             ::operator[]((map<QPDFObjGen,_QPDF::ObjCache,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_>_>
                           *)(pp_Var1 + 0x35),(key_type *)&local_160);
    __val_00 = pmVar3->end_before_space;
    __val_01 = pmVar3->end_after_space;
  }
  lVar4 = QIntC::IntConverter<unsigned_long,_long_long,_false,_true>::convert(&length_local);
  __val = lVar4 + length;
  if ((__val_00 <= __val) && (__val <= __val_01)) {
    QPDFObjectHandle::pipeStreamData(&H,(Pipeline *)offset,0,qpdf_dl_specialized,false,false);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&length_obj.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&H.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    QVar6.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = extraout_RDX._M_pi;
    QVar6.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (QPDFObjectHandle)
           QVar6.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
  }
  std::__cxx11::to_string(&local_70,__val);
  std::operator+(&local_50,"expected = ",&local_70);
  std::operator+(&local_f0,&local_50,"; actual = ");
  std::__cxx11::to_string(&local_90,__val_00);
  std::operator+(&local_d0,&local_f0,&local_90);
  std::operator+(&local_130,&local_d0,"..");
  std::__cxx11::to_string(&local_b0,__val_01);
  std::operator+(&local_160,&local_130,&local_b0);
  msg._M_str = local_160._M_dataplus._M_p;
  msg._M_len = local_160._M_string_length;
  linearizationWarning((QPDF *)pl,msg);
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  pQVar5 = (QPDFExc *)__cxa_allocate_exception(0x80);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_160,"linearization dictionary",(allocator<char> *)&local_d0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_130,"hint table length mismatch",(allocator<char> *)&local_f0);
  damagedPDF(pQVar5,(QPDF *)pl,&local_160,&local_130);
  __cxa_throw(pQVar5,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
}

Assistant:

QPDFObjectHandle
QPDF::readHintStream(Pipeline& pl, qpdf_offset_t offset, size_t length)
{
    QPDFObjGen og;
    QPDFObjectHandle H =
        readObjectAtOffset(false, offset, "linearization hint stream", QPDFObjGen(0, 0), og, false);
    ObjCache& oc = m->obj_cache[og];
    qpdf_offset_t min_end_offset = oc.end_before_space;
    qpdf_offset_t max_end_offset = oc.end_after_space;
    if (!H.isStream()) {
        throw damagedPDF("linearization dictionary", "hint table is not a stream");
    }

    QPDFObjectHandle Hdict = H.getDict();

    // Some versions of Acrobat make /Length indirect and place it immediately after the stream,
    // increasing length to cover it, even though the specification says all objects in the
    // linearization parameter dictionary must be direct.  We have to get the file position of the
    // end of length in this case.
    QPDFObjectHandle length_obj = Hdict.getKey("/Length");
    if (length_obj.isIndirect()) {
        QTC::TC("qpdf", "QPDF hint table length indirect");
        // Force resolution
        (void)length_obj.getIntValue();
        ObjCache& oc2 = m->obj_cache[length_obj.getObjGen()];
        min_end_offset = oc2.end_before_space;
        max_end_offset = oc2.end_after_space;
    } else {
        QTC::TC("qpdf", "QPDF hint table length direct");
    }
    qpdf_offset_t computed_end = offset + toO(length);
    if ((computed_end < min_end_offset) || (computed_end > max_end_offset)) {
        linearizationWarning(
            "expected = " + std::to_string(computed_end) +
            "; actual = " + std::to_string(min_end_offset) + ".." + std::to_string(max_end_offset));
        throw damagedPDF("linearization dictionary", "hint table length mismatch");
    }
    H.pipeStreamData(&pl, 0, qpdf_dl_specialized);
    return Hdict;
}